

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O0

bool __thiscall
google::anon_unknown_8::LogCleaner::IsLogLastModifiedOver
          (LogCleaner *this,string *filepath,time_point *current_time)

{
  int iVar1;
  char *__file;
  duration<long,_std::ratio<1L,_1000000000L>_> local_c8;
  type diff;
  time_point last_modified_time;
  stat file_stat;
  time_point *current_time_local;
  string *filepath_local;
  LogCleaner *this_local;
  
  __file = (char *)std::__cxx11::string::c_str();
  iVar1 = stat(__file,(stat *)&last_modified_time);
  if (iVar1 == 0) {
    diff.__r = (rep)std::chrono::_V2::system_clock::from_time_t(file_stat.st_atim.tv_nsec);
    local_c8.__r = (rep)std::chrono::operator-
                                  (current_time,
                                   (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                    *)&diff);
    this_local._7_1_ = std::chrono::operator>=(&local_c8,&this->overdue_);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool LogCleaner::IsLogLastModifiedOver(
    const string& filepath,
    const std::chrono::system_clock::time_point& current_time) const {
  // Try to get the last modified time of this file.
  struct stat file_stat;

  if (stat(filepath.c_str(), &file_stat) == 0) {
    const auto last_modified_time =
        std::chrono::system_clock::from_time_t(file_stat.st_mtime);
    const auto diff = current_time - last_modified_time;
    return diff >= overdue_;
  }

  // If failed to get file stat, don't return true!
  return false;
}